

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZVec<int> *blocksizes,
          TPZFMatrix<std::complex<float>_> *glob)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t newsize;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  long local_88;
  complex<float> local_38;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBlockDiagonal_01667018;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01650620;
  (this->fStorage).fStore = (complex<float> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  (this->fBlockPos)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fBlockPos).fStore = (long *)0x0;
  (this->fBlockPos).fNElements = 0;
  (this->fBlockPos).fNAlloc = 0;
  TPZVec<int>::TPZVec(&this->fBlockSize,blocksizes);
  lVar9 = blocksizes->fNElements;
  local_38._M_value = 0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar9 + 1,(long *)&local_38);
  piVar2 = blocksizes->fStore;
  plVar3 = (this->fBlockPos).fStore;
  lVar6 = 0;
  if (lVar9 < 1) {
    lVar9 = lVar6;
  }
  newsize = 0;
  lVar7 = 0;
  for (; lVar9 != lVar6; lVar6 = lVar6 + 1) {
    iVar1 = piVar2[lVar6];
    lVar7 = lVar7 + iVar1;
    newsize = newsize + (ulong)(uint)(iVar1 * iVar1);
    plVar3[lVar6 + 1] = (ulong)(uint)(iVar1 * iVar1) + plVar3[lVar6];
  }
  local_38._M_value = 0;
  TPZVec<std::complex<float>_>::Resize(&this->fStorage,newsize,&local_38);
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = lVar7;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = lVar7;
  local_88 = 0;
  for (lVar6 = 0; lVar6 != lVar9; lVar6 = lVar6 + 1) {
    lVar5 = (long)(this->fBlockSize).fStore[lVar6];
    lVar7 = 0;
    if (0 < lVar5) {
      lVar7 = lVar5;
    }
    lVar10 = (this->fBlockPos).fStore[lVar6] << 3;
    for (lVar4 = 0; lVar4 != lVar7; lVar4 = lVar4 + 1) {
      lVar8 = local_88;
      lVar11 = lVar10;
      lVar12 = lVar5;
      while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
        (*(glob->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(glob,lVar4 + local_88,lVar8);
        *(ulong *)((long)&((this->fStorage).fStore)->_M_value + lVar11) =
             CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        lVar8 = lVar8 + 1;
        lVar11 = lVar11 + lVar5 * 8;
      }
      lVar10 = lVar10 + 8;
    }
    local_88 = local_88 + lVar5;
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}